

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O0

void __thiscall cmInstalledFile::SetName(cmInstalledFile *this,cmMakefile *mf,string *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  string local_88 [32];
  cmGeneratorExpression local_68;
  cmListFileBacktrace local_50;
  undefined1 local_40 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  string *name_local;
  cmMakefile *mf_local;
  cmInstalledFile *this_local;
  
  this_00 = &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount;
  cmMakefile::GetBacktrace((cmMakefile *)this_00);
  cmListFileBacktrace::cmListFileBacktrace(&local_50,(cmListFileBacktrace *)this_00);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_40,&local_50);
  cmListFileBacktrace::~cmListFileBacktrace(&local_50);
  std::__cxx11::string::operator=((string *)this,(string *)name);
  std::__cxx11::string::string(local_88,(string *)name);
  cmGeneratorExpression::Parse(&local_68,(string *)local_40);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  operator=(&this->NameExpression,
            (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             *)&local_68);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_68);
  std::__cxx11::string::~string(local_88);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_40);
  cmListFileBacktrace::~cmListFileBacktrace
            ((cmListFileBacktrace *)
             &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void cmInstalledFile::SetName(cmMakefile* mf, const std::string& name)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(backtrace);

  this->Name = name;
  this->NameExpression = ge.Parse(name);
}